

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::stackUnder(QWidget *this,QWidget *w)

{
  long lVar1;
  long *plVar2;
  QWidgetPrivate *this_00;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  QWidgetPrivate *pQVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((w != (QWidget *)0x0) &&
      (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
        super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) && (w != this)) {
    this_00 = *(QWidgetPrivate **)&this->field_0x8;
    lVar3 = *(long *)&this_00->field_0x10;
    if (lVar3 == *(long *)(*(long *)&w->field_0x8 + 0x10)) {
      pQVar7 = this_00;
      if (lVar3 != 0) {
        lVar4 = *(long *)(lVar3 + 8);
        lVar5 = *(long *)(lVar4 + 0x28);
        if (lVar5 == 0) {
          iVar6 = -1;
          iVar9 = -1;
        }
        else {
          lVar10 = -8;
          do {
            if (lVar5 * -8 + lVar10 == -8) {
              iVar6 = -1;
              goto LAB_0030e4f4;
            }
            lVar1 = lVar10 + 8;
            plVar2 = (long *)(*(long *)(lVar4 + 0x20) + 8 + lVar10);
            lVar10 = lVar1;
          } while ((QWidget *)*plVar2 != this);
          iVar6 = (int)(lVar1 >> 3);
LAB_0030e4f4:
          lVar10 = 0;
          iVar8 = -1;
          do {
            iVar9 = -1;
            if (lVar5 * 8 == lVar10) break;
            iVar9 = iVar8 + 1;
            plVar2 = (long *)(*(long *)(lVar4 + 0x20) + lVar10);
            lVar10 = lVar10 + 8;
            iVar8 = iVar9;
          } while ((QWidget *)*plVar2 != w);
        }
        iVar9 = iVar9 - (uint)(iVar6 < iVar9);
        if (iVar9 != iVar6) {
          w = (QWidget *)(long)iVar6;
          QList<QObject_*>::move((QList<QObject_*> *)(lVar4 + 0x18),(qsizetype)w,(long)iVar9);
          pQVar7 = *(QWidgetPrivate **)&this->field_0x8;
        }
        if (((pQVar7->high_attributes[0] & 0x10000000) == 0) &&
           ((*(byte *)(*(long *)(lVar3 + 8) + 0x243) & 0x10) != 0)) {
          w = (QWidget *)0x0;
          create(this,0,false,false);
          pQVar7 = *(QWidgetPrivate **)&this->field_0x8;
        }
        else if (iVar9 == iVar6) goto LAB_0030e5b2;
      }
      if ((pQVar7->high_attributes[0] & 0x10000000) != 0) {
        QWidgetPrivate::stackUnder_sys(this_00,w);
      }
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      QEvent::QEvent((QEvent *)&local_48,ZOrderChange);
      QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&local_48);
      QEvent::~QEvent((QEvent *)&local_48);
    }
  }
LAB_0030e5b2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::stackUnder(QWidget* w)
{
    Q_D(QWidget);
    QWidget *p = parentWidget();
    if (!w || isWindow() || p != w->parentWidget() || this == w)
        return;
    if (p) {
        int from = p->d_func()->children.indexOf(this);
        int to = p->d_func()->children.indexOf(w);
        Q_ASSERT(from >= 0);
        Q_ASSERT(to >= 0);
        if (from < to)
            --to;
        // Do nothing if the widget is already in correct stacking order _and_ created.
        if (from != to)
            p->d_func()->children.move(from, to);
        if (!testAttribute(Qt::WA_WState_Created) && p->testAttribute(Qt::WA_WState_Created))
            create();
        else if (from == to)
            return;
    }
    if (testAttribute(Qt::WA_WState_Created))
        d->stackUnder_sys(w);

    QEvent e(QEvent::ZOrderChange);
    QCoreApplication::sendEvent(this, &e);
}